

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ref_node.c
# Opt level: O0

REF_STATUS ref_node_remove_invalidates_sorted(REF_NODE ref_node,REF_INT node)

{
  REF_STATUS ref_private_macro_code_rss;
  REF_INT node_local;
  REF_NODE ref_node_local;
  
  if (((node < 0) || (ref_node->max <= node)) || (ref_node->global[node] < 0)) {
    ref_node_local._4_4_ = 3;
  }
  else {
    ref_node_local._4_4_ = ref_node_push_unused(ref_node,ref_node->global[node]);
    if (ref_node_local._4_4_ == 0) {
      ref_node->global[node] = (long)ref_node->blank;
      ref_node->blank = -2 - node;
      ref_node->n = ref_node->n + -1;
      ref_node_local._4_4_ = 0;
    }
    else {
      printf("%s: %d: %s: %d %s\n",
             "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_node.c",0x1c3,
             "ref_node_remove_invalidates_sorted",(ulong)ref_node_local._4_4_,"store unused global")
      ;
    }
  }
  return ref_node_local._4_4_;
}

Assistant:

REF_FCN REF_STATUS ref_node_remove_invalidates_sorted(REF_NODE ref_node,
                                                      REF_INT node) {
  if (!ref_node_valid(ref_node, node)) return REF_INVALID;

  RSS(ref_node_push_unused(ref_node, ref_node->global[node]),
      "store unused global");

  ref_node->global[node] = ref_node->blank;
  ref_node->blank = index2next(node);

  (ref_node->n)--;

  return REF_SUCCESS;
}